

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

OneHotEncoder * __thiscall CoreML::Specification::Model::mutable_onehotencoder(Model *this)

{
  bool bVar1;
  OneHotEncoder *this_00;
  Model *this_local;
  
  bVar1 = has_onehotencoder(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_onehotencoder(this);
    this_00 = (OneHotEncoder *)operator_new(0x28);
    OneHotEncoder::OneHotEncoder(this_00);
    (this->Type_).onehotencoder_ = this_00;
  }
  return (OneHotEncoder *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::OneHotEncoder* Model::mutable_onehotencoder() {
  if (!has_onehotencoder()) {
    clear_Type();
    set_has_onehotencoder();
    Type_.onehotencoder_ = new ::CoreML::Specification::OneHotEncoder;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.oneHotEncoder)
  return Type_.onehotencoder_;
}